

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

vm_obj_id_t __thiscall CVmMetaclass::get_supermeta(CVmMetaclass *this,int idx)

{
  CVmMetaTable *pCVar1;
  long lVar2;
  CVmMetaclass *this_00;
  vm_meta_entry_t *pvVar3;
  int in_ESI;
  CVmMetaTable *in_RDI;
  vm_meta_entry_t *entry;
  vm_obj_id_t local_34;
  vm_obj_id_t local_4;
  
  if (in_ESI == 0) {
    lVar2 = (*(code *)in_RDI->table_[1].prop_xlat_)();
    pCVar1 = G_meta_table_X;
    if (lVar2 == 0) {
      local_4 = 0;
    }
    else {
      this_00 = (CVmMetaclass *)(*(code *)in_RDI->table_[1].prop_xlat_)();
      get_reg_idx(this_00);
      pvVar3 = CVmMetaTable::get_entry_from_reg(in_RDI,(int)((ulong)pCVar1 >> 0x20));
      if (pvVar3 == (vm_meta_entry_t *)0x0) {
        local_34 = 0;
      }
      else {
        local_34 = pvVar3->class_obj_;
      }
      local_4 = local_34;
    }
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

vm_obj_id_t CVmMetaclass::get_supermeta(VMG_ int idx) const
{
    vm_meta_entry_t *entry;

    /* we only have one supermetaclass */
    if (idx != 0)
        return VM_INVALID_OBJ;

    /* if I don't have a supermetaclass at all, return nil */
    if (get_supermeta_reg() == 0)
        return VM_INVALID_OBJ;

    /* look up my supermetaclass entry */
    entry = (G_meta_table->get_entry_from_reg(
        get_supermeta_reg()->get_reg_idx()));

    /* return the IntrinsicClass object that represents this metaclass */
    return (entry != 0 ? entry->class_obj_ : VM_INVALID_OBJ);
}